

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

bool phmap::priv::operator==
               (raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *a,raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *b)

{
  char cVar1;
  uint uVar2;
  ctrl_t *pcVar3;
  size_t sVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  undefined1 auVar11 [11];
  undefined1 auVar12 [12];
  undefined1 auVar13 [13];
  undefined1 auVar14 [14];
  char *pcVar15;
  bool bVar16;
  uint uVar17;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this;
  anon_union_8_1_a8a14541_for_iterator_1 aVar18;
  bool bVar19;
  char in_XMM1_Ba;
  char in_XMM1_Bb;
  char in_XMM1_Bc;
  char in_XMM1_Bd;
  char in_XMM1_Be;
  char in_XMM1_Bf;
  char in_XMM1_Bg;
  char in_XMM1_Bh;
  char in_XMM1_Bi;
  char in_XMM1_Bj;
  char in_XMM1_Bk;
  char in_XMM1_Bl;
  char in_XMM1_Bm;
  char in_XMM1_Bn;
  char in_XMM1_Bo;
  byte in_XMM1_Bp;
  iterator iVar20;
  
  if (a->size_ == b->size_) {
    this = a;
    if (b->capacity_ < a->capacity_) {
      this = b;
      b = a;
    }
    iVar20 = raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::begin(this);
    pcVar3 = this->ctrl_;
    sVar4 = this->capacity_;
    bVar19 = iVar20.ctrl_ == pcVar3 + sVar4;
    if (!bVar19) {
      uVar2 = *(uint *)iVar20.field_1.slot_;
      while( true ) {
        bVar16 = raw_hash_set<phmap::priv::FlatHashMapPolicy<phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::Enum,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::has_element(b,(value_type *)iVar20.field_1.slot_,
                               SUB168(ZEXT416(uVar2) * ZEXT816(0xde5fb9d2630458e9),8) +
                               SUB168(ZEXT416(uVar2) * ZEXT816(0xde5fb9d2630458e9),0));
        if (!bVar16) break;
        aVar18.slot_ = iVar20.field_1.slot_ + 1;
        cVar1 = iVar20.ctrl_[1];
        pcVar15 = iVar20.ctrl_ + 1;
        while (cVar1 < -1) {
          iVar7 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba)))
                         == CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))
                                    ));
          iVar8 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be)))
                         == CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))
                                    ));
          iVar9 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi)))
                         == CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))
                                    ));
          iVar10 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm)))
                          == CONCAT13(in_XMM1_Bp,
                                      CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))));
          in_XMM1_Ba = -(*pcVar15 < (char)iVar7);
          in_XMM1_Bb = -(pcVar15[1] < (char)((uint)iVar7 >> 8));
          in_XMM1_Bc = -(pcVar15[2] < (char)((uint)iVar7 >> 0x10));
          in_XMM1_Bd = -(pcVar15[3] < (char)((uint)iVar7 >> 0x18));
          in_XMM1_Be = -(pcVar15[4] < (char)iVar8);
          in_XMM1_Bf = -(pcVar15[5] < (char)((uint)iVar8 >> 8));
          in_XMM1_Bg = -(pcVar15[6] < (char)((uint)iVar8 >> 0x10));
          in_XMM1_Bh = -(pcVar15[7] < (char)((uint)iVar8 >> 0x18));
          in_XMM1_Bi = -(pcVar15[8] < (char)iVar9);
          in_XMM1_Bj = -(pcVar15[9] < (char)((uint)iVar9 >> 8));
          in_XMM1_Bk = -(pcVar15[10] < (char)((uint)iVar9 >> 0x10));
          in_XMM1_Bl = -(pcVar15[0xb] < (char)((uint)iVar9 >> 0x18));
          in_XMM1_Bm = -(pcVar15[0xc] < (char)iVar10);
          in_XMM1_Bn = -(pcVar15[0xd] < (char)((uint)iVar10 >> 8));
          in_XMM1_Bo = -(pcVar15[0xe] < (char)((uint)iVar10 >> 0x10));
          in_XMM1_Bp = -(pcVar15[0xf] < (char)((uint)iVar10 >> 0x18));
          auVar5[1] = in_XMM1_Bb;
          auVar5[0] = in_XMM1_Ba;
          auVar5[2] = in_XMM1_Bc;
          auVar5[3] = in_XMM1_Bd;
          auVar5[4] = in_XMM1_Be;
          auVar5[5] = in_XMM1_Bf;
          auVar5[6] = in_XMM1_Bg;
          auVar5[7] = in_XMM1_Bh;
          auVar5[8] = in_XMM1_Bi;
          auVar5[9] = in_XMM1_Bj;
          auVar5[10] = in_XMM1_Bk;
          auVar5[0xb] = in_XMM1_Bl;
          auVar5[0xc] = in_XMM1_Bm;
          auVar5[0xd] = in_XMM1_Bn;
          auVar5[0xe] = in_XMM1_Bo;
          auVar5[0xf] = in_XMM1_Bp;
          auVar6[1] = in_XMM1_Bb;
          auVar6[0] = in_XMM1_Ba;
          auVar6[2] = in_XMM1_Bc;
          auVar6[3] = in_XMM1_Bd;
          auVar6[4] = in_XMM1_Be;
          auVar6[5] = in_XMM1_Bf;
          auVar6[6] = in_XMM1_Bg;
          auVar6[7] = in_XMM1_Bh;
          auVar6[8] = in_XMM1_Bi;
          auVar6[9] = in_XMM1_Bj;
          auVar6[10] = in_XMM1_Bk;
          auVar6[0xb] = in_XMM1_Bl;
          auVar6[0xc] = in_XMM1_Bm;
          auVar6[0xd] = in_XMM1_Bn;
          auVar6[0xe] = in_XMM1_Bo;
          auVar6[0xf] = in_XMM1_Bp;
          auVar14[1] = in_XMM1_Bd;
          auVar14[0] = in_XMM1_Bc;
          auVar14[2] = in_XMM1_Be;
          auVar14[3] = in_XMM1_Bf;
          auVar14[4] = in_XMM1_Bg;
          auVar14[5] = in_XMM1_Bh;
          auVar14[6] = in_XMM1_Bi;
          auVar14[7] = in_XMM1_Bj;
          auVar14[8] = in_XMM1_Bk;
          auVar14[9] = in_XMM1_Bl;
          auVar14[10] = in_XMM1_Bm;
          auVar14[0xb] = in_XMM1_Bn;
          auVar14[0xc] = in_XMM1_Bo;
          auVar14[0xd] = in_XMM1_Bp;
          auVar13[1] = in_XMM1_Be;
          auVar13[0] = in_XMM1_Bd;
          auVar13[2] = in_XMM1_Bf;
          auVar13[3] = in_XMM1_Bg;
          auVar13[4] = in_XMM1_Bh;
          auVar13[5] = in_XMM1_Bi;
          auVar13[6] = in_XMM1_Bj;
          auVar13[7] = in_XMM1_Bk;
          auVar13[8] = in_XMM1_Bl;
          auVar13[9] = in_XMM1_Bm;
          auVar13[10] = in_XMM1_Bn;
          auVar13[0xb] = in_XMM1_Bo;
          auVar13[0xc] = in_XMM1_Bp;
          auVar12[1] = in_XMM1_Bf;
          auVar12[0] = in_XMM1_Be;
          auVar12[2] = in_XMM1_Bg;
          auVar12[3] = in_XMM1_Bh;
          auVar12[4] = in_XMM1_Bi;
          auVar12[5] = in_XMM1_Bj;
          auVar12[6] = in_XMM1_Bk;
          auVar12[7] = in_XMM1_Bl;
          auVar12[8] = in_XMM1_Bm;
          auVar12[9] = in_XMM1_Bn;
          auVar12[10] = in_XMM1_Bo;
          auVar12[0xb] = in_XMM1_Bp;
          auVar11[1] = in_XMM1_Bg;
          auVar11[0] = in_XMM1_Bf;
          auVar11[2] = in_XMM1_Bh;
          auVar11[3] = in_XMM1_Bi;
          auVar11[4] = in_XMM1_Bj;
          auVar11[5] = in_XMM1_Bk;
          auVar11[6] = in_XMM1_Bl;
          auVar11[7] = in_XMM1_Bm;
          auVar11[8] = in_XMM1_Bn;
          auVar11[9] = in_XMM1_Bo;
          auVar11[10] = in_XMM1_Bp;
          uVar17 = (ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar6 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB141(auVar14 >> 7,0) & 1) << 2 |
                            (ushort)(SUB131(auVar13 >> 7,0) & 1) << 3 |
                            (ushort)(SUB121(auVar12 >> 7,0) & 1) << 4 |
                            (ushort)(SUB111(auVar11 >> 7,0) & 1) << 5 |
                            (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                                     CONCAT18(in_XMM1_Bo,
                                                              CONCAT17(in_XMM1_Bn,
                                                                       CONCAT16(in_XMM1_Bm,
                                                                                CONCAT15(in_XMM1_Bl,
                                                                                         CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                            (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                                     CONCAT17(in_XMM1_Bo,
                                                              CONCAT16(in_XMM1_Bn,
                                                                       CONCAT15(in_XMM1_Bm,
                                                                                CONCAT14(in_XMM1_Bl,
                                                                                         CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                           7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
          uVar2 = 0;
          if (uVar17 != 0) {
            for (; (uVar17 >> uVar2 & 1) == 0; uVar2 = uVar2 + 1) {
            }
          }
          aVar18.slot_ = aVar18.slot_ + uVar2;
          cVar1 = pcVar15[uVar2];
          pcVar15 = pcVar15 + uVar2;
        }
        iVar20.field_1.slot_ = aVar18.slot_;
        iVar20.ctrl_ = pcVar15;
        bVar19 = pcVar15 == pcVar3 + sVar4;
        if (bVar19) {
          return bVar19;
        }
        uVar2 = *(uint *)aVar18.slot_;
      }
    }
  }
  else {
    bVar19 = false;
  }
  return bVar19;
}

Assistant:

size_t capacity() const { return capacity_; }